

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.h
# Opt level: O0

int Varint::Length32(uint32 v)

{
  int iVar1;
  uint32 log2value;
  uint32 v_local;
  
  iVar1 = Bits::Log2FloorNonZero(v | 1);
  return iVar1 * 9 + 0x49U >> 6;
}

Assistant:

inline int Varint::Length32(uint32 v) {
  // This computes value == 0 ? 1 : floor(log2(v)) / 7 + 1
  // Use an explicit multiplication to implement the divide of
  // a number in the 1..31 range.
  // Explicit OR 0x1 to handle v == 0.
  uint32 log2value = Bits::Log2FloorNonZero(v | 0x1);
  return static_cast<int>((log2value * 9 + 73) / 64);
}